

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::ParameterSetupErrorsTest
          (ParameterSetupErrorsTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"textures_parameter_setup_errors",
             "Texture Parameter Setup Errors Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01de0e90;
  this->m_to_2D = 0;
  this->m_to_2D_ms = 0;
  this->m_to_rectangle = 0;
  this->m_to_invalid = 0;
  this->m_pname_invalid = 0;
  this->m_depth_stencil_mode_invalid = 0;
  return;
}

Assistant:

ParameterSetupErrorsTest::ParameterSetupErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "textures_parameter_setup_errors", "Texture Parameter Setup Errors Test")
	, m_to_2D(0)
	, m_to_2D_ms(0)
	, m_to_rectangle(0)
	, m_to_invalid(0)
	, m_pname_invalid(0)
	, m_depth_stencil_mode_invalid(0)
{
	/* Intentionally left blank. */
}